

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::RecurrentParameter::InternalSwap(RecurrentParameter *this,RecurrentParameter *other)

{
  InternalMetadataWithArena *this_00;
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  FillerParameter *pFVar4;
  void *pvVar5;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar6;
  UnknownFieldSet *pUVar7;
  UnknownFieldSet *pUVar8;
  
  pFVar4 = this->weight_filler_;
  this->weight_filler_ = other->weight_filler_;
  other->weight_filler_ = pFVar4;
  pFVar4 = this->bias_filler_;
  this->bias_filler_ = other->bias_filler_;
  other->bias_filler_ = pFVar4;
  uVar2 = this->num_output_;
  this->num_output_ = other->num_output_;
  other->num_output_ = uVar2;
  bVar1 = this->debug_info_;
  this->debug_info_ = other->debug_info_;
  other->debug_info_ = bVar1;
  bVar1 = this->expose_hidden_;
  this->expose_hidden_ = other->expose_hidden_;
  other->expose_hidden_ = bVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar5 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar5 & 1) == 0) {
      pUVar8 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar8 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
    }
    pvVar5 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar5 & 1) == 0) {
      pUVar7 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar7 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
    }
    pvVar6 = pUVar7->fields_;
    pUVar7->fields_ = pUVar8->fields_;
    pUVar8->fields_ = pvVar6;
  }
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void RecurrentParameter::InternalSwap(RecurrentParameter* other) {
  std::swap(weight_filler_, other->weight_filler_);
  std::swap(bias_filler_, other->bias_filler_);
  std::swap(num_output_, other->num_output_);
  std::swap(debug_info_, other->debug_info_);
  std::swap(expose_hidden_, other->expose_hidden_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}